

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O3

int Abc_NtkDarProve(Abc_Ntk_t *pNtk,Fra_Sec_t *pSecPar,int nBmcFramesMax,int nBmcConfMax)

{
  Abc_Cex_t *pAVar1;
  int iVar2;
  int iVar3;
  Aig_Man_t *pAig;
  long lVar4;
  long lVar5;
  char *format;
  int iVar6;
  Aig_Man_t *pAVar7;
  Abc_Cex_t *__ptr;
  Abc_Ntk_t *pAVar8;
  long lVar9;
  timespec ts_1;
  int iFrame;
  Abc_Ntk_t *pNtkComb;
  timespec ts;
  
  iFrame = -1;
  iVar2 = clock_gettime(3,(timespec *)&ts);
  if (iVar2 < 0) {
    lVar5 = -1;
  }
  else {
    lVar5 = CONCAT44(ts.tv_nsec._4_4_,(undefined4)ts.tv_nsec) / 1000 + ts.tv_sec * 1000000;
  }
  if ((pSecPar->fTryComb != 0) || (pNtk->nObjCounts[8] == 0)) {
    iVar3 = 3;
    iVar2 = clock_gettime(3,(timespec *)&ts_1);
    if (iVar2 < 0) {
      lVar9 = -1;
    }
    else {
      lVar9 = ts_1.tv_nsec / 1000 + ts_1.tv_sec * 1000000;
    }
    if (pNtk->nObjCounts[8] == 0) {
      Abc_Print(iVar3,"The network has no latches. Running CEC.\n");
    }
    pNtkComb = Abc_NtkDup(pNtk);
    Abc_NtkMakeComb(pNtkComb,1);
    Prove_ParamsSetDefault((Prove_Params_t *)&ts);
    ts.tv_nsec._4_4_ = 1;
    iVar2 = Abc_NtkIvyProve(&pNtkComb,(Prove_Params_t *)&ts);
    if (iVar2 == 0) {
      if (pNtk->nObjCounts[8] == 0) {
        pNtk->pModel = pNtkComb->pModel;
        pNtkComb->pModel = (int *)0x0;
        pAVar8 = pNtkComb;
        Abc_Print((int)pNtkComb,"Networks are not equivalent.\n");
        Abc_Print((int)pAVar8,"%s =","Time");
        iVar6 = 3;
        iVar3 = clock_gettime(3,(timespec *)&ts_1);
        if (iVar3 < 0) {
          lVar4 = -1;
        }
        else {
          lVar4 = ts_1.tv_nsec / 1000 + ts_1.tv_sec * 1000000;
        }
        Abc_Print(iVar6,"%9.2f sec\n",(double)(lVar4 - lVar9) / 1000000.0);
        if (pSecPar->fReportSolution == 0) {
          return 0;
        }
        format = "SOLUTION: FAIL       ";
        goto LAB_0024de1f;
      }
      Abc_NtkDelete(pNtkComb);
    }
    else {
      pAVar8 = pNtkComb;
      Abc_NtkDelete(pNtkComb);
      iVar3 = (int)pAVar8;
      if (iVar2 == 1) {
        Abc_Print(iVar3,"Networks are equivalent after CEC.   ");
        Abc_Print(iVar3,"%s =","Time");
        iVar6 = 3;
        iVar3 = clock_gettime(3,(timespec *)&ts_1);
        if (iVar3 < 0) {
          lVar4 = -1;
        }
        else {
          lVar4 = ts_1.tv_nsec / 1000 + ts_1.tv_sec * 1000000;
        }
        Abc_Print(iVar6,"%9.2f sec\n",(double)(lVar4 - lVar9) / 1000000.0);
        if (pSecPar->fReportSolution == 0) {
          return 1;
        }
        format = "SOLUTION: PASS       ";
LAB_0024de1f:
        Abc_Print(iVar6,format);
        Abc_Print(iVar6,"%s =","Time");
        iVar6 = 3;
        iVar3 = clock_gettime(3,(timespec *)&ts_1);
        if (iVar3 < 0) {
          lVar9 = -1;
        }
        else {
          lVar9 = ts_1.tv_nsec / 1000 + ts_1.tv_sec * 1000000;
        }
        Abc_Print(iVar6,"%9.2f sec\n",(double)(lVar9 - lVar5) / 1000000.0);
        return iVar2;
      }
    }
  }
  pAVar8 = pNtk;
  pAig = Abc_NtkToDar(pNtk,0,1);
  if (pAig == (Aig_Man_t *)0x0) {
    Abc_Print((int)pAVar8,"Converting miter into AIG has failed.\n");
    iVar2 = -1;
  }
  else {
    if (pAig->nRegs < 1) {
      __assert_fail("pMan->nRegs > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDar.c"
                    ,0xb0c,"int Abc_NtkDarProve(Abc_Ntk_t *, Fra_Sec_t *, int, int)");
    }
    if (pSecPar->fTryBmc != 0) {
      pAVar7 = pAig;
      iVar2 = Saig_BmcPerform(pAig,0,nBmcFramesMax,2000,0,nBmcConfMax,0,pSecPar->fVerbose,0,&iFrame,
                              0);
      iVar3 = (int)pAVar7;
      if (iVar2 == 0) {
        Abc_Print(iVar3,"Networks are not equivalent.\n");
        if (pSecPar->fReportSolution != 0) {
          Abc_Print(iVar3,"SOLUTION: FAIL       ");
          Abc_Print(iVar3,"%s =","Time");
          iVar3 = 3;
          iVar2 = clock_gettime(3,(timespec *)&ts);
          if (iVar2 < 0) {
            lVar9 = -1;
          }
          else {
            lVar9 = CONCAT44(ts.tv_nsec._4_4_,(undefined4)ts.tv_nsec) / 1000 + ts.tv_sec * 1000000;
          }
          Abc_Print(iVar3,"%9.2f sec\n",(double)(lVar9 - lVar5) / 1000000.0);
        }
        if (pNtk->pModel != (int *)0x0) {
          free(pNtk->pModel);
          pNtk->pModel = (int *)0x0;
        }
        if (pNtk->pSeqModel != (Abc_Cex_t *)0x0) {
          free(pNtk->pSeqModel);
        }
        pNtk->pSeqModel = pAig->pSeqModel;
        pAig->pSeqModel = (Abc_Cex_t *)0x0;
        Aig_ManStop(pAig);
        return 0;
      }
    }
    if (pSecPar->fUseNewProver == 0) {
      iVar2 = Fra_FraigSec(pAig,pSecPar,(Aig_Man_t **)0x0);
      if (pNtk->pModel != (int *)0x0) {
        free(pNtk->pModel);
        pNtk->pModel = (int *)0x0;
      }
      __ptr = pNtk->pSeqModel;
      if (__ptr != (Abc_Cex_t *)0x0) {
        free(__ptr);
      }
      pAVar1 = pAig->pSeqModel;
      pNtk->pSeqModel = pAVar1;
      pAig->pSeqModel = (Abc_Cex_t *)0x0;
      if (pAVar1 != (Abc_Cex_t *)0x0) {
        Abc_Print((int)__ptr,"Output %d of miter \"%s\" was asserted in frame %d.\n",
                  (ulong)(uint)pAVar1->iPo,pNtk->pName,(ulong)(uint)pAVar1->iFrame);
        pAVar7 = pAig;
        iVar3 = Saig_ManVerifyCex(pAig,pNtk->pSeqModel);
        if (iVar3 == 0) {
          Abc_Print((int)pAVar7,"Abc_NtkDarProve(): Counter-example verification has FAILED.\n");
        }
      }
    }
    else {
      iVar2 = Ssw_SecGeneralMiter(pAig,(Ssw_Pars_t *)0x0);
    }
    Aig_ManStop(pAig);
  }
  return iVar2;
}

Assistant:

int Abc_NtkDarProve( Abc_Ntk_t * pNtk, Fra_Sec_t * pSecPar, int nBmcFramesMax, int nBmcConfMax )
{
    Aig_Man_t * pMan;
    int iFrame = -1, RetValue = -1;
    abctime clkTotal = Abc_Clock();
    if ( pSecPar->fTryComb || Abc_NtkLatchNum(pNtk) == 0 )
    {
        Prove_Params_t Params, * pParams = &Params;
        Abc_Ntk_t * pNtkComb;
        int RetValue;
        abctime clk = Abc_Clock();
        if ( Abc_NtkLatchNum(pNtk) == 0 )
            Abc_Print( 1, "The network has no latches. Running CEC.\n" );
        // create combinational network
        pNtkComb = Abc_NtkDup( pNtk );
        Abc_NtkMakeComb( pNtkComb, 1 );
        // solve it using combinational equivalence checking
        Prove_ParamsSetDefault( pParams );
        pParams->fVerbose = 1;
        RetValue = Abc_NtkIvyProve( &pNtkComb, pParams );
        // transfer model if given
//        pNtk->pModel = pNtkComb->pModel; pNtkComb->pModel = NULL;
        if ( RetValue == 0  && (Abc_NtkLatchNum(pNtk) == 0) )
        {
            pNtk->pModel = pNtkComb->pModel; pNtkComb->pModel = NULL;
            Abc_Print( 1, "Networks are not equivalent.\n" );
            ABC_PRT( "Time", Abc_Clock() - clk );
            if ( pSecPar->fReportSolution )
            {
                Abc_Print( 1, "SOLUTION: FAIL       " );
                ABC_PRT( "Time", Abc_Clock() - clkTotal );
            }
            return RetValue;
        }
        Abc_NtkDelete( pNtkComb );
        // return the result, if solved
        if ( RetValue == 1 )
        {
            Abc_Print( 1, "Networks are equivalent after CEC.   " );
            ABC_PRT( "Time", Abc_Clock() - clk );
            if ( pSecPar->fReportSolution )
            {
            Abc_Print( 1, "SOLUTION: PASS       " );
            ABC_PRT( "Time", Abc_Clock() - clkTotal );
            }
            return RetValue;
        }
    }
    // derive the AIG manager
    pMan = Abc_NtkToDar( pNtk, 0, 1 );
    if ( pMan == NULL )
    {
        Abc_Print( 1, "Converting miter into AIG has failed.\n" );
        return -1;
    }
    assert( pMan->nRegs > 0 );

    if ( pSecPar->fTryBmc )
    {
        RetValue = Saig_BmcPerform( pMan, 0, nBmcFramesMax, 2000, 0, nBmcConfMax, 0, pSecPar->fVerbose, 0, &iFrame, 0 );
        if ( RetValue == 0 )
        {
            Abc_Print( 1, "Networks are not equivalent.\n" );
            if ( pSecPar->fReportSolution )
            {
                Abc_Print( 1, "SOLUTION: FAIL       " );
                ABC_PRT( "Time", Abc_Clock() - clkTotal );
            }
            // return the counter-example generated
            ABC_FREE( pNtk->pModel );
            ABC_FREE( pNtk->pSeqModel );
            pNtk->pSeqModel = pMan->pSeqModel; pMan->pSeqModel = NULL;
            Aig_ManStop( pMan );
            return RetValue;
        }
    } 
    // perform verification
    if ( pSecPar->fUseNewProver )
    {
        RetValue = Ssw_SecGeneralMiter( pMan, NULL );
    }
    else
    {
        RetValue = Fra_FraigSec( pMan, pSecPar, NULL );
        ABC_FREE( pNtk->pModel );
        ABC_FREE( pNtk->pSeqModel );
        pNtk->pSeqModel = pMan->pSeqModel; pMan->pSeqModel = NULL;
        if ( pNtk->pSeqModel )
        {
            Abc_Cex_t * pCex = pNtk->pSeqModel;
            Abc_Print( 1, "Output %d of miter \"%s\" was asserted in frame %d.\n", pCex->iPo, pNtk->pName, pCex->iFrame );
            if ( !Saig_ManVerifyCex( pMan, pNtk->pSeqModel ) )
                Abc_Print( 1, "Abc_NtkDarProve(): Counter-example verification has FAILED.\n" );
        }
    }
    Aig_ManStop( pMan );
    return RetValue;
}